

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_solid.cc
# Opt level: O3

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::GdiNv3::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,GdiNv3 *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  uint32_t uVar1;
  SingleMthdTest *pSVar2;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *pvVar3;
  result_type rVar4;
  MthdVtxXy *pMVar5;
  MthdIfcSize *pMVar6;
  Test *pTVar7;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_801;
  MthdIfcSize *local_800;
  MthdIfcSize *local_7f8;
  Test *local_7f0;
  Test *local_7e8;
  Test *local_7e0;
  MthdVtxXy *local_7d8;
  Test *local_7d0;
  Test *local_7c8;
  Test *local_7c0;
  Test *local_7b8;
  Test *local_7b0;
  Test *local_7a8;
  Test *local_7a0;
  Test *local_798;
  Test *local_790;
  Test *local_788;
  Test *local_780;
  Test *local_778;
  Test *local_770;
  Test *local_768;
  Test *local_760;
  Test *local_758;
  Test *local_750;
  Test *local_748;
  Test *local_740;
  Test *local_738;
  Test *local_730;
  Test *local_728;
  Test *local_720;
  Test *local_718;
  SingleMthdTest *local_710;
  _func_int **local_708;
  undefined1 *local_700;
  long local_6f8;
  undefined1 local_6f0 [16];
  undefined1 *local_6e0;
  long local_6d8;
  undefined1 local_6d0 [16];
  undefined1 *local_6c0;
  long local_6b8;
  undefined1 local_6b0 [16];
  undefined1 *local_6a0;
  long local_698;
  undefined1 local_690 [16];
  undefined1 *local_680;
  long local_678;
  undefined1 local_670 [16];
  undefined1 *local_660;
  long local_658;
  undefined1 local_650 [16];
  undefined1 *local_640;
  long local_638;
  undefined1 local_630 [16];
  undefined1 *local_620;
  long local_618;
  undefined1 local_610 [16];
  undefined1 *local_600;
  long local_5f8;
  undefined1 local_5f0 [16];
  undefined1 *local_5e0;
  long local_5d8;
  undefined1 local_5d0 [16];
  undefined1 *local_5c0;
  long local_5b8;
  undefined1 local_5b0 [16];
  undefined1 *local_5a0;
  long local_598;
  undefined1 local_590 [16];
  undefined1 *local_580;
  long local_578;
  undefined1 local_570 [16];
  undefined1 *local_560;
  long local_558;
  undefined1 local_550 [16];
  MthdIfcSize *local_540;
  MthdIfcSize *local_538;
  MthdVtxXy *local_530;
  MthdIfcSize *local_528;
  MthdVtxXy *local_520;
  MthdVtxXy *local_518;
  MthdVtxXy *local_510;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_508;
  undefined1 *local_500;
  long local_4f8;
  undefined1 local_4f0 [16];
  undefined1 *local_4e0;
  long local_4d8;
  undefined1 local_4d0 [16];
  undefined1 *local_4c0;
  long local_4b8;
  undefined1 local_4b0 [16];
  undefined1 *local_4a0;
  long local_498;
  undefined1 local_490 [16];
  undefined1 *local_480;
  long local_478;
  undefined1 local_470 [16];
  undefined1 *local_460;
  long local_458;
  undefined1 local_450 [16];
  undefined1 *local_440;
  long local_438;
  undefined1 local_430 [16];
  undefined1 *local_420;
  long local_418;
  undefined1 local_410 [16];
  undefined1 *local_400;
  long local_3f8;
  undefined1 local_3f0 [16];
  undefined1 *local_3e0;
  long local_3d8;
  undefined1 local_3d0 [16];
  undefined1 *local_3c0;
  long local_3b8;
  undefined1 local_3b0 [16];
  undefined1 *local_3a0;
  long local_398;
  undefined1 local_390 [16];
  undefined1 *local_380;
  long local_378;
  undefined1 local_370 [16];
  undefined1 *local_360;
  long local_358;
  undefined1 local_350 [16];
  undefined1 *local_340;
  long local_338;
  undefined1 local_330 [16];
  undefined1 *local_320;
  long local_318;
  undefined1 local_310 [16];
  undefined1 *local_300;
  long local_2f8;
  undefined1 local_2f0 [16];
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  SingleMthdTest *local_180;
  Test *local_178;
  Test *local_170;
  Test *local_168;
  Test *local_160;
  Test *local_158;
  Test *local_150;
  Test *local_148;
  Test *local_140;
  Test *local_138;
  Test *local_130;
  Test *local_128;
  Test *local_120;
  Test *local_118;
  MthdVtxXy *local_110;
  Test *local_108;
  Test *local_100;
  Test *local_f8;
  Test *local_f0;
  MthdVtxXy *local_e8;
  MthdVtxXy *local_e0;
  Test *local_d8;
  Test *local_d0;
  Test *local_c8;
  MthdIfcSize *local_c0;
  MthdVtxXy *local_b8;
  Test *local_b0;
  Test *local_a8;
  Test *local_a0;
  Test *local_98;
  MthdIfcSize *local_90;
  MthdIfcSize *local_88;
  MthdVtxXy *local_80;
  Test *local_78;
  Test *local_70;
  Test *local_68;
  Test *local_60;
  Test *local_58;
  MthdIfcSize *local_50;
  MthdIfcSize *local_48;
  MthdVtxXy *local_40;
  Test *local_38;
  
  local_508 = __return_storage_ptr__;
  local_710 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_560 = local_550;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_560,"nop","");
  pSVar2 = local_710;
  opt = &(this->super_Class).opt;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)local_710,opt,(uint32_t)rVar4);
  (pSVar2->super_MthdTest).trapbit = -1;
  (pSVar2->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00356770;
  pSVar2->s_cls = uVar1;
  pSVar2->s_mthd = 0x100;
  pSVar2->s_stride = 4;
  pSVar2->s_num = 1;
  pSVar2->s_trapbit = -1;
  (pSVar2->name)._M_dataplus._M_p = (pointer)&(pSVar2->name).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&pSVar2->name,local_560,local_560 + local_558)
  ;
  (pSVar2->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00356aa0;
  local_180 = pSVar2;
  local_718 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_580 = local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"notify","");
  pTVar7 = local_718;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_718,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x104;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_580,local_580 + local_578);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356c90;
  local_178 = pTVar7;
  local_720 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_5a0 = local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"patch","");
  pTVar7 = local_720;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_720,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x10c;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_5a0,local_5a0 + local_598);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357830;
  local_170 = pTVar7;
  local_728 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_5c0 = local_5b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c0,"pm_trigger","");
  pTVar7 = local_728;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_728,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x140;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_5c0,local_5c0 + local_5b8);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00358ad0;
  local_168 = pTVar7;
  local_730 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_5e0 = local_5d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e0,"dma_notify","");
  pTVar7 = local_730;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_730,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x180;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 1;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_5e0,local_5e0 + local_5d8);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357928;
  local_160 = pTVar7;
  local_738 = (Test *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_600 = local_5f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_600,"ctx_pattern","");
  pTVar7 = local_738;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_738,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x184;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 3;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_600,local_600 + local_5f8);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357358;
  *(undefined1 *)(pTVar7[0x1e].rnd._M_x + 0x119) = 0;
  local_158 = pTVar7;
  local_740 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_620 = local_610;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_620,"ctx_rop","");
  pTVar7 = local_740;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_740,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x188;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 4;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_620,local_620 + local_618);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357b18;
  local_150 = pTVar7;
  local_748 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_640 = local_630;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_640,"ctx_beta","");
  pTVar7 = local_748;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_748,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x18c;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 5;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_640,local_640 + local_638);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357c10;
  local_148 = pTVar7;
  local_750 = (Test *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_660 = local_650;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_660,"ctx_dst","");
  pTVar7 = local_750;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_750,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 400;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 7;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_660,local_660 + local_658);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357450;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x119) = 0;
  local_140 = pTVar7;
  local_758 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_680 = local_670;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_680,"missing","");
  pTVar7 = local_758;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_758,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x200;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_680,local_680 + local_678);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00358790;
  local_138 = pTVar7;
  local_760 = (Test *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_6a0 = local_690;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"operation","");
  pTVar7 = local_760;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_760,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x2fc;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 8;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_6a0,local_6a0 + local_698);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00357168;
  *(undefined1 *)(pTVar7[0x1e].rnd._M_x + 0x119) = 0;
  local_130 = pTVar7;
  local_768 = (Test *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_6c0 = local_6b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c0,"format","");
  pTVar7 = local_768;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_768,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x300;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 9;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_6c0,local_6c0 + local_6b8);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035ac10;
  *(undefined1 *)(pTVar7[0x1e].rnd._M_x + 0x119) = 0;
  local_128 = pTVar7;
  local_770 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_6e0 = local_6d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e0,"bitmap_format","");
  pTVar7 = local_770;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_770,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x304;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 10;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_6e0,local_6e0 + local_6d8);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00358888;
  local_120 = pTVar7;
  local_778 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_700 = local_6f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_700,"a.color","");
  pTVar7 = local_778;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_778,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x3fc;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0xb;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_700,local_700 + local_6f8);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035a7d8;
  local_118 = pTVar7;
  pMVar5 = (MthdVtxXy *)operator_new(0x25958);
  local_510 = pMVar5;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"a.xy","");
  MthdVtxXy::MthdVtxXy
            (pMVar5,opt,(uint32_t)rVar4,&local_1a0,0xe,(this->super_Class).cls,0x400,0x40,8,0x11);
  local_110 = pMVar5;
  local_780 = (Test *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_320 = local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"a.rect","");
  pTVar7 = local_780;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_780,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x404;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 8;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 0x40;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0xf;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_320,local_320 + local_318);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00358148;
  *(undefined2 *)(pTVar7[0x1e].rnd._M_x + 0x119) = 0x101;
  local_108 = pTVar7;
  local_788 = (Test *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_340 = local_330;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"b.clip_xy_0","");
  pTVar7 = local_788;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_788,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x7f4;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0x10;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_340,local_340 + local_338);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359958;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x119) = 1;
  *(undefined1 *)((long)pTVar7[0x1e].rnd._M_x + 0x8cc) = 0;
  local_100 = pTVar7;
  local_790 = (Test *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_360 = local_350;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"b.clip_xy_1","");
  pTVar7 = local_790;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_790,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x7f8;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0x11;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_360,local_360 + local_358);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359958;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x119) = 1;
  *(undefined1 *)((long)pTVar7[0x1e].rnd._M_x + 0x8cc) = 1;
  local_f8 = pTVar7;
  local_798 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_380 = local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"b.color","");
  pTVar7 = local_798;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_798,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x7fc;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0xb;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_380,local_380 + local_378);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035a7d8;
  local_f0 = pTVar7;
  pMVar5 = (MthdVtxXy *)operator_new(0x25958);
  local_518 = pMVar5;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"b.0.xy","");
  MthdVtxXy::MthdVtxXy
            (pMVar5,opt,(uint32_t)rVar4,&local_1c0,0x12,(this->super_Class).cls,0x800,0x40,8,1);
  local_e8 = pMVar5;
  pMVar5 = (MthdVtxXy *)operator_new(0x25958);
  local_520 = pMVar5;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"b.1.xy","");
  MthdVtxXy::MthdVtxXy
            (pMVar5,opt,(uint32_t)rVar4,&local_1e0,-1,(this->super_Class).cls,0x804,0x40,8,4);
  local_e0 = pMVar5;
  local_7a0 = (Test *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3a0 = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"c.clip_xy_0","");
  pTVar7 = local_7a0;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_7a0,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0xbec;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0x10;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_3a0,local_3a0 + local_398);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359958;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x119) = 1;
  *(undefined1 *)((long)pTVar7[0x1e].rnd._M_x + 0x8cc) = 0;
  local_d8 = pTVar7;
  local_7a8 = (Test *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3c0 = local_3b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"c.clip_xy_1","");
  pTVar7 = local_7a8;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_7a8,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0xbf0;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0x11;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_3c0,local_3c0 + local_3b8);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359958;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x119) = 1;
  *(undefined1 *)((long)pTVar7[0x1e].rnd._M_x + 0x8cc) = 1;
  local_d0 = pTVar7;
  local_7b0 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3e0 = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"c.color","");
  pTVar7 = local_7b0;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_7b0,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0xbf4;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0xc;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_3e0,local_3e0 + local_3d8);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035a9c8;
  local_c8 = pTVar7;
  pMVar6 = (MthdIfcSize *)operator_new(0x25958);
  local_528 = pMVar6;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"c.size","");
  MthdIfcSize::MthdIfcSize
            (pMVar6,opt,(uint32_t)rVar4,&local_200,0x15,(this->super_Class).cls,0xbf8,0x16);
  local_c0 = pMVar6;
  pMVar5 = (MthdVtxXy *)operator_new(0x25958);
  local_530 = pMVar5;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"c.xy","");
  MthdVtxXy::MthdVtxXy
            (pMVar5,opt,(uint32_t)rVar4,&local_220,0x14,(this->super_Class).cls,0xbfc,1,4,0x21);
  local_b8 = pMVar5;
  local_7b8 = (Test *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_400 = local_3f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"c.bitmap_data","");
  pTVar7 = local_7b8;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_7b8,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0xc00;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 0x80;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0x18;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_400,local_400 + local_3f8);
  local_708 = (_func_int **)&PTR__SingleMthdTest_0035b1e0;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035b1e0;
  *(undefined1 *)(pTVar7[0x1e].rnd._M_x + 0x119) = 0;
  local_b0 = pTVar7;
  local_7c0 = (Test *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_420 = local_410;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"d.clip_xy_0","");
  pTVar7 = local_7c0;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_7c0,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0xfe8;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0x10;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_420,local_420 + local_418);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359958;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x119) = 1;
  *(undefined1 *)((long)pTVar7[0x1e].rnd._M_x + 0x8cc) = 0;
  local_a8 = pTVar7;
  local_7c8 = (Test *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_440 = local_430;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"d.clip_xy_1","");
  pTVar7 = local_7c8;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_7c8,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0xfec;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0x11;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_440,local_440 + local_438);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359958;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x119) = 1;
  *(undefined1 *)((long)pTVar7[0x1e].rnd._M_x + 0x8cc) = 1;
  local_a0 = pTVar7;
  local_7d0 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_460 = local_450;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"d.color","");
  pTVar7 = local_7d0;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_7d0,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0xff0;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0xc;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_460,local_460 + local_458);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035a9c8;
  local_98 = pTVar7;
  pMVar6 = (MthdIfcSize *)operator_new(0x25958);
  local_538 = pMVar6;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"d.size_in","");
  MthdIfcSize::MthdIfcSize
            (pMVar6,opt,(uint32_t)rVar4,&local_240,0x16,(this->super_Class).cls,0xff4,0x12);
  local_90 = pMVar6;
  pMVar6 = (MthdIfcSize *)operator_new(0x25958);
  local_540 = pMVar6;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"d.size_out","");
  MthdIfcSize::MthdIfcSize
            (pMVar6,opt,(uint32_t)rVar4,&local_260,0x17,(this->super_Class).cls,0xff8,0x14);
  local_88 = pMVar6;
  local_7d8 = (MthdVtxXy *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"d.xy","");
  pMVar5 = local_7d8;
  MthdVtxXy::MthdVtxXy
            (local_7d8,opt,(uint32_t)rVar4,&local_280,0x14,(this->super_Class).cls,0xffc,1,4,0x21);
  local_80 = pMVar5;
  local_7e0 = (Test *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_480 = local_470;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"d.bitmap_data","");
  pTVar7 = local_7e0;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_7e0,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x1000;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 0x80;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0x18;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_480,local_480 + local_478);
  pTVar7->_vptr_Test = local_708;
  *(undefined1 *)(pTVar7[0x1e].rnd._M_x + 0x119) = 0;
  local_78 = pTVar7;
  local_7e8 = (Test *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_4a0 = local_490;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a0,"e.clip_xy_0","");
  pTVar7 = local_7e8;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_7e8,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x13e4;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0x10;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_4a0,local_4a0 + local_498);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359958;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x119) = 1;
  *(undefined1 *)((long)pTVar7[0x1e].rnd._M_x + 0x8cc) = 0;
  local_70 = pTVar7;
  local_7f0 = (Test *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_4c0 = local_4b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"e.clip_xy_1","");
  pTVar7 = local_7f0;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_7f0,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x13e8;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0x11;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_4c0,local_4c0 + local_4b8);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359958;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x119) = 1;
  *(undefined1 *)((long)pTVar7[0x1e].rnd._M_x + 0x8cc) = 1;
  local_68 = pTVar7;
  pTVar7 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_4e0 = local_4d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"e.color0","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar7,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x13ec;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0xd;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_4e0,local_4e0 + local_4d8);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035a8d0;
  local_60 = pTVar7;
  pTVar7 = (Test *)operator_new(0x25950);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_500 = local_4f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"e.color1","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar7,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x13f0;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0xc;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_500,local_500 + local_4f8);
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0035a9c8;
  local_58 = pTVar7;
  local_7f8 = (MthdIfcSize *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"e.size_in","");
  pMVar6 = local_7f8;
  MthdIfcSize::MthdIfcSize
            (local_7f8,opt,(uint32_t)rVar4,&local_2a0,0x16,(this->super_Class).cls,0x13f4,0x12);
  local_50 = pMVar6;
  local_800 = (MthdIfcSize *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"e.size_out","");
  pMVar6 = local_800;
  MthdIfcSize::MthdIfcSize
            (local_800,opt,(uint32_t)rVar4,&local_2c0,0x17,(this->super_Class).cls,0x13f8,0x14);
  local_48 = pMVar6;
  pMVar5 = (MthdVtxXy *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"e.xy","");
  MthdVtxXy::MthdVtxXy
            (pMVar5,opt,(uint32_t)rVar4,&local_2e0,0x14,(this->super_Class).cls,0x13fc,1,4,0x21);
  local_40 = pMVar5;
  pTVar7 = (Test *)operator_new(0x25958);
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_300 = local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"e.bitmap_data","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar7,opt,(uint32_t)rVar4);
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar7->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00356770;
  *(uint32_t *)(pTVar7[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x894) = 0x1400;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar7[0x1e].rnd._M_x + 0x89c) = 0x80;
  *(undefined4 *)(pTVar7[0x1e].rnd._M_x + 0x114) = 0x19;
  pTVar7[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar7[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar7[0x1e].rnd._M_x + 0x115),local_300,local_300 + local_2f8);
  pvVar3 = local_508;
  pTVar7->_vptr_Test = local_708;
  *(undefined1 *)(pTVar7[0x1e].rnd._M_x + 0x119) = 1;
  __l._M_len = 0x2a;
  __l._M_array = &local_180;
  local_38 = pTVar7;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_508,__l,&local_801);
  if (local_300 != local_2f0) {
    operator_delete(local_300);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  if (local_500 != local_4f0) {
    operator_delete(local_500);
  }
  if (local_4e0 != local_4d0) {
    operator_delete(local_4e0);
  }
  if (local_4c0 != local_4b0) {
    operator_delete(local_4c0);
  }
  if (local_4a0 != local_490) {
    operator_delete(local_4a0);
  }
  if (local_480 != local_470) {
    operator_delete(local_480);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  if (local_460 != local_450) {
    operator_delete(local_460);
  }
  if (local_440 != local_430) {
    operator_delete(local_440);
  }
  if (local_420 != local_410) {
    operator_delete(local_420);
  }
  if (local_400 != local_3f0) {
    operator_delete(local_400);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  if (local_3e0 != local_3d0) {
    operator_delete(local_3e0);
  }
  if (local_3c0 != local_3b0) {
    operator_delete(local_3c0);
  }
  if (local_3a0 != local_390) {
    operator_delete(local_3a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if (local_380 != local_370) {
    operator_delete(local_380);
  }
  if (local_360 != local_350) {
    operator_delete(local_360);
  }
  if (local_340 != local_330) {
    operator_delete(local_340);
  }
  if (local_320 != local_310) {
    operator_delete(local_320);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  if (local_700 != local_6f0) {
    operator_delete(local_700);
  }
  if (local_6e0 != local_6d0) {
    operator_delete(local_6e0);
  }
  if (local_6c0 != local_6b0) {
    operator_delete(local_6c0);
  }
  if (local_6a0 != local_690) {
    operator_delete(local_6a0);
  }
  if (local_680 != local_670) {
    operator_delete(local_680);
  }
  if (local_660 != local_650) {
    operator_delete(local_660);
  }
  if (local_640 != local_630) {
    operator_delete(local_640);
  }
  if (local_620 != local_610) {
    operator_delete(local_620);
  }
  if (local_600 != local_5f0) {
    operator_delete(local_600);
  }
  if (local_5e0 != local_5d0) {
    operator_delete(local_5e0);
  }
  if (local_5c0 != local_5b0) {
    operator_delete(local_5c0);
  }
  if (local_5a0 != local_590) {
    operator_delete(local_5a0);
  }
  if (local_580 != local_570) {
    operator_delete(local_580);
  }
  if (local_560 != local_550) {
    operator_delete(local_560);
  }
  return pvVar3;
}

Assistant:

std::vector<SingleMthdTest *> GdiNv3::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPatch(opt, rnd(), "patch", -1, cls, 0x10c),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdCtxPattern(opt, rnd(), "ctx_pattern", 3, cls, 0x184, false),
		new MthdCtxRop(opt, rnd(), "ctx_rop", 4, cls, 0x188),
		new MthdCtxBeta(opt, rnd(), "ctx_beta", 5, cls, 0x18c),
		new MthdCtxSurf(opt, rnd(), "ctx_dst", 7, cls, 0x190, 0),
		new MthdMissing(opt, rnd(), "missing", -1, cls, 0x200),
		new MthdOperation(opt, rnd(), "operation", 8, cls, 0x2fc, false),
		new MthdSolidFormat(opt, rnd(), "format", 9, cls, 0x300, false),
		new MthdBitmapFormat(opt, rnd(), "bitmap_format", 10, cls, 0x304),
		new MthdSolidColor(opt, rnd(), "a.color", 11, cls, 0x3fc),
		new MthdVtxXy(opt, rnd(), "a.xy", 14, cls, 0x400, 0x40, 8, VTX_FIRST | VTX_NOCLIP),
		new MthdRect(opt, rnd(), "a.rect", 15, cls, 0x404, 0x40, 8, VTX_DRAW | VTX_NOCLIP),
		new MthdClipXy(opt, rnd(), "b.clip_xy_0", 16, cls, 0x7f4, 1, 0),
		new MthdClipXy(opt, rnd(), "b.clip_xy_1", 17, cls, 0x7f8, 1, 1),
		new MthdSolidColor(opt, rnd(), "b.color", 11, cls, 0x7fc),
		new MthdVtxXy(opt, rnd(), "b.0.xy", 18, cls, 0x800, 0x40, 8, VTX_FIRST),
		new MthdVtxXy(opt, rnd(), "b.1.xy", -1, cls, 0x804, 0x40, 8, VTX_DRAW),
		new MthdClipXy(opt, rnd(), "c.clip_xy_0", 16, cls, 0xbec, 1, 0),
		new MthdClipXy(opt, rnd(), "c.clip_xy_1", 17, cls, 0xbf0, 1, 1),
		new MthdBitmapColor1(opt, rnd(), "c.color", 12, cls, 0xbf4),
		new MthdIfcSize(opt, rnd(), "c.size", 21, cls, 0xbf8, IFC_IN | IFC_OUT | IFC_BITMAP),
		new MthdVtxXy(opt, rnd(), "c.xy", 20, cls, 0xbfc, 1, 4, VTX_FIRST | VTX_IFC),
		new MthdBitmapData(opt, rnd(), "c.bitmap_data", 24, cls, 0xc00, 0x80, 4, false),
		new MthdClipXy(opt, rnd(), "d.clip_xy_0", 16, cls, 0xfe8, 1, 0),
		new MthdClipXy(opt, rnd(), "d.clip_xy_1", 17, cls, 0xfec, 1, 1),
		new MthdBitmapColor1(opt, rnd(), "d.color", 12, cls, 0xff0),
		new MthdIfcSize(opt, rnd(), "d.size_in", 22, cls, 0xff4, IFC_IN | IFC_BITMAP),
		new MthdIfcSize(opt, rnd(), "d.size_out", 23, cls, 0xff8, IFC_OUT | IFC_BITMAP),
		new MthdVtxXy(opt, rnd(), "d.xy", 20, cls, 0xffc, 1, 4, VTX_FIRST | VTX_IFC),
		new MthdBitmapData(opt, rnd(), "d.bitmap_data", 24, cls, 0x1000, 0x80, 4, false),
		new MthdClipXy(opt, rnd(), "e.clip_xy_0", 16, cls, 0x13e4, 1, 0),
		new MthdClipXy(opt, rnd(), "e.clip_xy_1", 17, cls, 0x13e8, 1, 1),
		new MthdBitmapColor0(opt, rnd(), "e.color0", 13, cls, 0x13ec),
		new MthdBitmapColor1(opt, rnd(), "e.color1", 12, cls, 0x13f0),
		new MthdIfcSize(opt, rnd(), "e.size_in", 22, cls, 0x13f4, IFC_IN | IFC_BITMAP),
		new MthdIfcSize(opt, rnd(), "e.size_out", 23, cls, 0x13f8, IFC_OUT | IFC_BITMAP),
		new MthdVtxXy(opt, rnd(), "e.xy", 20, cls, 0x13fc, 1, 4, VTX_FIRST | VTX_IFC),
		new MthdBitmapData(opt, rnd(), "e.bitmap_data", 25, cls, 0x1400, 0x80, 4, true),
	};
}